

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O0

void __thiscall
sjtu::OrderManager::buy_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *this_00;
  int in_ECX;
  UserManager *in_RSI;
  orderType *in_RDI;
  long in_R8;
  pair<unsigned_long_long,_int> pVar6;
  orderType *in_stack_000000c0;
  TrainManager *in_stack_000000c8;
  orderType *tmp;
  int i;
  bool ifpending;
  int unum;
  timeType uday;
  string uto;
  string ufrom;
  string utrain;
  string uname;
  value_type *in_stack_00000800;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *in_stack_00000808;
  size_t *in_stack_fffffffffffffda8;
  pair<unsigned_long_long,_int> *in_stack_fffffffffffffdb0;
  orderType *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  timeType *in_stack_fffffffffffffdd0;
  allocator *str;
  StringHasher *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  OrderManager *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  allocator local_191;
  string local_190 [32];
  hashType local_170;
  unsigned_long_long local_168;
  int local_160;
  pair<std::pair<unsigned_long_long,_int>,_long> local_158;
  pair<const_std::pair<unsigned_long_long,_int>,_long> local_140;
  char *local_128;
  string local_120 [32];
  string local_100 [32];
  timeType local_e0;
  int local_d0;
  byte local_c9;
  int local_c8;
  timeType local_b8;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  long local_28;
  int local_1c;
  UserManager *local_10;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  timeType::timeType(&local_b8);
  local_c9 = 0;
  for (local_d0 = 0; local_d0 < local_1c; local_d0 = local_d0 + 2) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
    if (bVar1) {
      std::__cxx11::string::operator=(local_48,(string *)((long)local_d0 * 0x20 + 0x20 + local_28));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      if (bVar1) {
        std::__cxx11::string::operator=
                  (local_68,(string *)((long)local_d0 * 0x20 + 0x20 + local_28));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
        if (bVar1) {
          std::__cxx11::string::string
                    (local_100,(string *)((long)local_d0 * 0x20 + 0x20 + local_28));
          timeType::timeType(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          local_b8.month = local_e0.month;
          local_b8.day = local_e0.day;
          local_b8.hour = local_e0.hour;
          local_b8.minute = local_e0.minute;
          std::__cxx11::string::~string(local_100);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
          if (bVar1) {
            local_c8 = std::__cxx11::stoi((string *)in_stack_fffffffffffffdb0,
                                          in_stack_fffffffffffffda8,0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
            if (bVar1) {
              std::__cxx11::string::operator=
                        (local_88,(string *)((long)local_d0 * 0x20 + 0x20 + local_28));
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8
                                     );
              if (bVar1) {
                std::__cxx11::string::operator=
                          (local_a8,(string *)((long)local_d0 * 0x20 + 0x20 + local_28));
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)in_stack_fffffffffffffdb0,
                                        (char *)in_stack_fffffffffffffda8);
                if (bVar1) {
                  local_c9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffffdb0,
                                             (char *)in_stack_fffffffffffffda8);
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::string(local_120,local_48);
  bVar1 = UserManager::is_login
                    (local_10,(string *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  uVar2 = (uint)bVar1;
  std::__cxx11::string::~string(local_120);
  if (uVar2 == 0) {
    pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    pcVar4 = (char *)operator_new(0xb8);
    orderType::orderType(in_stack_fffffffffffffdc0);
    local_128 = pcVar4;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar4,pcVar5);
    pcVar4 = local_128 + 0x15;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar4,pcVar5);
    pcVar4 = local_128 + 0x4c;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar4,pcVar5);
    pcVar4 = local_128 + 0x75;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar4,pcVar5);
    *(int *)(local_128 + 0xa0) = local_c8;
    *(undefined8 *)(local_128 + 0x2c) = local_b8._0_8_;
    *(undefined8 *)(local_128 + 0x34) = local_b8._8_8_;
    bVar1 = TrainManager::buy_ticket(in_stack_000000c8,in_stack_000000c0);
    if (bVar1) {
      if (*(int *)(local_128 + 0xa8) == 0) {
        UserManager::add_order
                  ((UserManager *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58,in_RDI);
        pvVar3 = (void *)std::ostream::operator<<
                                   (&std::cout,
                                    *(int *)(local_128 + 0xa4) * *(int *)(local_128 + 0xa0));
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      else if ((local_c9 & 1) == 0) {
        pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        local_128[0xa8] = '\x01';
        local_128[0xa9] = '\0';
        local_128[0xaa] = '\0';
        local_128[0xab] = '\0';
        UserManager::add_order
                  ((UserManager *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58,in_RDI);
        pcVar4 = local_128 + 0x15;
        str = &local_191;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_190,pcVar4,str);
        local_170 = StringHasher::operator()(in_stack_fffffffffffffde0,(string *)str);
        *(int *)(in_RDI->username + 4) = *(int *)(in_RDI->username + 4) + 1;
        pVar6 = std::make_pair<unsigned_long_long,int&>
                          (&in_stack_fffffffffffffdb0->first,(int *)in_stack_fffffffffffffda8);
        local_168 = pVar6.first;
        local_160 = pVar6.second;
        std::make_pair<std::pair<unsigned_long_long,int>,long&>
                  (in_stack_fffffffffffffdb0,(long *)in_stack_fffffffffffffda8);
        std::pair<const_std::pair<unsigned_long_long,_int>,_long>::
        pair<std::pair<unsigned_long_long,_int>,_long,_true>(&local_140,&local_158);
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::insert(in_stack_00000808,in_stack_00000800);
        std::__cxx11::string::~string(local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        this_00 = std::operator<<((ostream *)&std::cout,"queue");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      pvVar3 = (void *)std::ostream::operator<<(&std::cout,-1);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    if (local_128 != (char *)0x0) {
      operator_delete(local_128,0xb8);
    }
  }
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void buy_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname, utrain, ufrom, uto;timeType uday;
            int unum;
            bool ifpending = false;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-i") utrain = argv[i + 1];
                else if (argv[i] == "-d") uday = timeType(argv[i + 1]);
                else if (argv[i] == "-n") unum = stoi(argv[i + 1]);
                else if (argv[i] == "-f") ufrom = argv[i + 1];
                else if (argv[i] == "-t") uto = argv[i + 1];
                else if (argv[i] == "-q") {
                    if (argv[i + 1] == "true") ifpending = true;
                    else ifpending = false;
                }
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                strcpy(tmp->trainID, utrain.c_str());
                strcpy(tmp->station[0], ufrom.c_str());
                strcpy(tmp->station[1], uto.c_str());
                tmp -> num = unum;
                tmp->date[0] = uday;
                if (train_manager->buy_ticket(tmp) == false) std::cout << -1 << std::endl;
                else {
                    if (tmp->status == success) {
                        user_manager->add_order(this, tmp);
                        std::cout << tmp->price * tmp->num << std::endl;
                    }
                    else {
                        if (ifpending == false) std::cout << -1 << std::endl;
                        else {
                            tmp->status = pending;
                            user_manager->add_order(this, tmp);
                            PendingBpTree->insert(std::make_pair(std::make_pair(hasher(tmp->trainID), ++ pending_id), tmp->offset));
                            std::cout << "queue" << std::endl;
                        }
                    }
                }
                delete tmp;
            }
        }